

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_stbvorbis_read_pcm_frames
                    (ma_stbvorbis *pVorbis,void *pFramesOut,ma_uint64 frameCount,
                    ma_uint64 *pFramesRead)

{
  void *pvVar1;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int framesRead;
  ma_uint64 framesRemaining;
  ma_uint8 *pNewData;
  size_t newCap;
  size_t bytesRead;
  int consumedDataSize;
  int samplesRead;
  ma_uint32 iChannel;
  ma_uint64 iFrame;
  ma_uint32 framesToReadFromCache;
  float *pFramesOutF32;
  ma_uint32 channels;
  ma_format format;
  ma_uint64 totalFramesRead;
  ma_result result;
  ma_allocation_callbacks *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ma_uint32 *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  ma_stbvorbis *in_stack_ffffffffffffff78;
  float *in_stack_ffffffffffffff80;
  long in_stack_ffffffffffffff88;
  stb_vorbis *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint local_5c;
  ulong local_58;
  long local_48;
  int local_3c;
  ulong local_38;
  ma_result local_2c;
  ma_result local_4;
  
  if (in_RCX != (ulong *)0x0) {
    *in_RCX = 0;
  }
  if (in_RDX == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (in_RDI == 0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    local_2c = MA_SUCCESS;
    local_38 = 0;
    ma_stbvorbis_get_data_format
              (in_stack_ffffffffffffff78,
               (ma_format *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff68,
               (ma_uint32 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (ma_channel *)in_stack_ffffffffffffff58,0x24347a);
    if (local_3c == 5) {
      local_48 = in_RSI;
      if (*(int *)(in_RDI + 0xa8) == 0) {
        do {
          if (in_RDX <= local_38) break;
          pvVar1 = (void *)(in_RDX - local_38);
          if ((void *)0x7fffffff < pvVar1) {
            pvVar1 = (void *)0x7fffffff;
          }
          ma_offset_pcm_frames_ptr
                    (pvVar1,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     (ma_format)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                     (ma_uint32)in_stack_ffffffffffffff68);
          in_stack_ffffffffffffff74 =
               stb_vorbis_get_samples_float_interleaved
                         (in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                          in_stack_ffffffffffffff80,(int)((ulong)pvVar1 >> 0x20));
          local_38 = (long)in_stack_ffffffffffffff74 + local_38;
        } while ((int)pvVar1 <= in_stack_ffffffffffffff74);
      }
      else {
        do {
          if (in_RDX <= local_38) break;
          if ((ulong)*(uint *)(in_RDI + 0xd4) < in_RDX - local_38) {
            pvVar1 = (void *)(ulong)*(uint *)(in_RDI + 0xd4);
          }
          else {
            pvVar1 = (void *)(in_RDX - local_38);
          }
          if (in_RSI != 0) {
            for (local_58 = 0; local_58 < ((ulong)pvVar1 & 0xffffffff); local_58 = local_58 + 1) {
              for (local_5c = 0; local_5c < *(uint *)(in_RDI + 0x8c); local_5c = local_5c + 1) {
                *(undefined4 *)(local_48 + (ulong)local_5c * 4) =
                     *(undefined4 *)
                      (*(long *)(*(long *)(in_RDI + 0xd8) + (ulong)local_5c * 8) +
                      (*(uint *)(in_RDI + 0xd0) + local_58) * 4);
              }
              local_48 = local_48 + (ulong)*(uint *)(in_RDI + 0x8c) * 4;
            }
          }
          *(int *)(in_RDI + 0xd0) = (int)pvVar1 + *(int *)(in_RDI + 0xd0);
          *(int *)(in_RDI + 0xd4) = *(int *)(in_RDI + 0xd4) - (int)pvVar1;
          local_38 = ((ulong)pvVar1 & 0xffffffff) + local_38;
          if (local_38 == in_RDX) break;
          do {
            if (0x7fffffff < *(ulong *)(in_RDI + 0xb8)) break;
            in_stack_ffffffffffffff9c =
                 stb_vorbis_decode_frame_pushdata
                           ((stb_vorbis *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (uint8 *)in_stack_ffffffffffffff90,
                            (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                            (int *)in_stack_ffffffffffffff80,(float ***)in_stack_ffffffffffffff78,
                            (int *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
            if (in_stack_ffffffffffffff9c != 0) {
              *(long *)(in_RDI + 0xb8) = *(long *)(in_RDI + 0xb8) - (long)in_stack_ffffffffffffff9c;
              memmove(*(void **)(in_RDI + 0xb0),
                      (void *)(*(long *)(in_RDI + 0xb0) + (long)in_stack_ffffffffffffff9c),
                      *(size_t *)(in_RDI + 0xb8));
              *(undefined4 *)(in_RDI + 0xd0) = 0;
              *(undefined4 *)(in_RDI + 0xd4) = 0;
              break;
            }
            if (*(long *)(in_RDI + 0xc0) == *(long *)(in_RDI + 0xb8)) {
              in_stack_ffffffffffffff88 = *(long *)(in_RDI + 0xc0) + 0x1000;
              in_stack_ffffffffffffff80 =
                   (float *)ma_realloc(pvVar1,CONCAT44(in_stack_ffffffffffffff64,
                                                       in_stack_ffffffffffffff60),
                                       in_stack_ffffffffffffff58);
              if (in_stack_ffffffffffffff80 == (float *)0x0) {
                local_2c = MA_OUT_OF_MEMORY;
                break;
              }
              *(float **)(in_RDI + 0xb0) = in_stack_ffffffffffffff80;
              *(long *)(in_RDI + 0xc0) = in_stack_ffffffffffffff88;
            }
            local_2c = (**(code **)(in_RDI + 0x48))
                                 (*(undefined8 *)(in_RDI + 0x60),
                                  *(long *)(in_RDI + 0xb0) + *(long *)(in_RDI + 0xb8),
                                  *(long *)(in_RDI + 0xc0) - *(long *)(in_RDI + 0xb8),
                                  &stack0xffffffffffffff90);
            *(uint8 **)(in_RDI + 0xb8) =
                 (uint8 *)((long)&in_stack_ffffffffffffff90->sample_rate + *(long *)(in_RDI + 0xb8))
            ;
          } while (local_2c == MA_SUCCESS);
        } while (local_2c == MA_SUCCESS);
      }
    }
    else {
      local_2c = MA_INVALID_ARGS;
    }
    *(ulong *)(in_RDI + 0x98) = local_38 + *(long *)(in_RDI + 0x98);
    if (local_38 == 0) {
      local_2c = MA_AT_END;
    }
    if (in_RCX != (ulong *)0x0) {
      *in_RCX = local_38;
    }
    if ((local_2c == MA_SUCCESS) && (local_38 == 0)) {
      local_2c = MA_AT_END;
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_stbvorbis_read_pcm_frames(ma_stbvorbis* pVorbis, void* pFramesOut, ma_uint64 frameCount, ma_uint64* pFramesRead)
{
    if (pFramesRead != NULL) {
        *pFramesRead = 0;
    }

    if (frameCount == 0) {
        return MA_INVALID_ARGS;
    }

    if (pVorbis == NULL) {
        return MA_INVALID_ARGS;
    }

    #if !defined(MA_NO_VORBIS)
    {
        /* We always use floating point format. */
        ma_result result = MA_SUCCESS;  /* Must be initialized to MA_SUCCESS. */
        ma_uint64 totalFramesRead = 0;
        ma_format format;
        ma_uint32 channels;

        ma_stbvorbis_get_data_format(pVorbis, &format, &channels, NULL, NULL, 0);

        if (format == ma_format_f32) {
            /* We read differently depending on whether or not we're using push mode. */
            if (pVorbis->usingPushMode) {
                /* Push mode. This is the complex case. */
                float* pFramesOutF32 = (float*)pFramesOut;

                while (totalFramesRead < frameCount) {
                    /* The first thing to do is read from any already-cached frames. */
                    ma_uint32 framesToReadFromCache = (ma_uint32)ma_min(pVorbis->push.framesRemaining, (frameCount - totalFramesRead));  /* Safe cast because pVorbis->framesRemaining is 32-bit. */

                    /* The output pointer can be null in which case we just treat it as a seek. */
                    if (pFramesOut != NULL) {
                        ma_uint64 iFrame;
                        for (iFrame = 0; iFrame < framesToReadFromCache; iFrame += 1) {
                            ma_uint32 iChannel;
                            for (iChannel = 0; iChannel < pVorbis->channels; iChannel += 1) {
                                pFramesOutF32[iChannel] = pVorbis->push.ppPacketData[iChannel][pVorbis->push.framesConsumed + iFrame];
                            }

                            pFramesOutF32 += pVorbis->channels;
                        }
                    }

                    /* Update pointers and counters. */
                    pVorbis->push.framesConsumed  += framesToReadFromCache;
                    pVorbis->push.framesRemaining -= framesToReadFromCache;
                    totalFramesRead               += framesToReadFromCache;

                    /* Don't bother reading any more frames right now if we've just finished loading. */
                    if (totalFramesRead == frameCount) {
                        break;
                    }

                    MA_ASSERT(pVorbis->push.framesRemaining == 0);

                    /* Getting here means we've run out of cached frames. We'll need to load some more. */
                    for (;;) {
                        int samplesRead = 0;
                        int consumedDataSize;

                        /* We need to case dataSize to an int, so make sure we can do it safely. */
                        if (pVorbis->push.dataSize > INT_MAX) {
                            break;  /* Too big. */
                        }

                        consumedDataSize = stb_vorbis_decode_frame_pushdata(pVorbis->stb, pVorbis->push.pData, (int)pVorbis->push.dataSize, NULL, &pVorbis->push.ppPacketData, &samplesRead);
                        if (consumedDataSize != 0) {
                            /* Successfully decoded a Vorbis frame. Consume the data. */
                            pVorbis->push.dataSize -= (size_t)consumedDataSize;
                            MA_MOVE_MEMORY(pVorbis->push.pData, ma_offset_ptr(pVorbis->push.pData, consumedDataSize), pVorbis->push.dataSize);

                            pVorbis->push.framesConsumed  = 0;
                            pVorbis->push.framesRemaining = samplesRead;

                            break;
                        } else {
                            /* Not enough data. Read more. */
                            size_t bytesRead;

                            /* Expand the data buffer if necessary. */
                            if (pVorbis->push.dataCapacity == pVorbis->push.dataSize) {
                                size_t newCap = pVorbis->push.dataCapacity + MA_VORBIS_DATA_CHUNK_SIZE;
                                ma_uint8* pNewData;

                                pNewData = (ma_uint8*)ma_realloc(pVorbis->push.pData, newCap, &pVorbis->allocationCallbacks);
                                if (pNewData == NULL) {
                                    result = MA_OUT_OF_MEMORY;
                                    break;
                                }

                                pVorbis->push.pData = pNewData;
                                pVorbis->push.dataCapacity = newCap;
                            }

                            /* We should have enough room to load some data. */
                            result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pVorbis->push.pData, pVorbis->push.dataSize), (pVorbis->push.dataCapacity - pVorbis->push.dataSize), &bytesRead);
                            pVorbis->push.dataSize += bytesRead;

                            if (result != MA_SUCCESS) {
                                break;  /* Failed to read any data. Get out. */
                            }
                        }
                    }

                    /* If we don't have a success code at this point it means we've encountered an error or the end of the file has been reached (probably the latter). */
                    if (result != MA_SUCCESS) {
                        break;
                    }
                }
            } else {
                /* Pull mode. This is the simple case, but we still need to run in a loop because stb_vorbis loves using 32-bit instead of 64-bit. */
                while (totalFramesRead < frameCount) {
                    ma_uint64 framesRemaining = (frameCount - totalFramesRead);
                    int framesRead;

                    if (framesRemaining > INT_MAX) {
                        framesRemaining = INT_MAX;
                    }

                    framesRead = stb_vorbis_get_samples_float_interleaved(pVorbis->stb, channels, (float*)ma_offset_pcm_frames_ptr(pFramesOut, totalFramesRead, format, channels), (int)framesRemaining * channels);   /* Safe cast. */
                    totalFramesRead += framesRead;

                    if (framesRead < (int)framesRemaining) {
                        break;  /* Nothing left to read. Get out. */
                    }
                }
            }
        } else {
            result = MA_INVALID_ARGS;
        }

        pVorbis->cursor += totalFramesRead;

        if (totalFramesRead == 0) {
            result = MA_AT_END;
        }

        if (pFramesRead != NULL) {
            *pFramesRead = totalFramesRead;
        }

        if (result == MA_SUCCESS && totalFramesRead == 0) {
            result  = MA_AT_END;
        }

        return result;
    }
    #else
    {
        /* vorbis is disabled. Should never hit this since initialization would have failed. */
        MA_ASSERT(MA_FALSE);

        (void)pFramesOut;
        (void)frameCount;
        (void)pFramesRead;

        return MA_NOT_IMPLEMENTED;
    }
    #endif
}